

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffrtnm(char *url,char *rootname,int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ushort **ppuVar7;
  size_t sVar8;
  char local_488 [8];
  char infile [1025];
  char local_78 [8];
  char urltype [20];
  char *local_58;
  char *ptr4;
  char *ptr3;
  char *ptr2;
  char *ptr1;
  int infilelen;
  int slen;
  int jj;
  int ii;
  int *status_local;
  char *rootname_local;
  char *url_local;
  
  if (0 < *status) {
    return *status;
  }
  *rootname = '\0';
  local_78[0] = '\0';
  local_488[0] = '\0';
  if (*url == '-') {
    strcat(local_78,"-");
    ptr2 = url + 1;
  }
  else {
    iVar3 = strncmp(url,"stdin",5);
    if ((iVar3 == 0) || (iVar3 = strncmp(url,"STDIN",5), iVar3 == 0)) {
      strcat(local_78,"-");
      ptr2 = url + 5;
    }
    else {
      ptr3 = strstr(url,"://");
      pcVar5 = strstr(url,"(");
      if ((pcVar5 != (char *)0x0) && (pcVar5 < ptr3)) {
        ptr3 = (char *)0x0;
      }
      if (ptr3 == (char *)0x0) {
        iVar3 = strncmp(url,"ftp:",4);
        if (iVar3 == 0) {
          strcat(local_78,"ftp://");
          ptr2 = url + 4;
        }
        else {
          iVar3 = strncmp(url,"gsiftp:",7);
          if (iVar3 == 0) {
            strcat(local_78,"gsiftp://");
            ptr2 = url + 7;
          }
          else {
            iVar3 = strncmp(url,"http:",5);
            if (iVar3 == 0) {
              strcat(local_78,"http://");
              ptr2 = url + 5;
            }
            else {
              iVar3 = strncmp(url,"mem:",4);
              if (iVar3 == 0) {
                strcat(local_78,"mem://");
                ptr2 = url + 4;
              }
              else {
                iVar3 = strncmp(url,"shmem:",6);
                if (iVar3 == 0) {
                  strcat(local_78,"shmem://");
                  ptr2 = url + 6;
                }
                else {
                  iVar3 = strncmp(url,"file:",5);
                  ptr2 = url;
                  if (iVar3 == 0) {
                    ptr2 = url + 5;
                  }
                }
              }
            }
          }
        }
      }
      else {
        if (0x13 < (long)(ptr3 + (3 - (long)url))) {
          *status = 0x7d;
          return 0x7d;
        }
        strncat(local_78,url,(size_t)(ptr3 + (3 - (long)url)));
        ptr2 = ptr3 + 3;
      }
    }
  }
  ptr3 = strchr(ptr2,0x28);
  pcVar5 = strchr(ptr2,0x5b);
  if (ptr3 != (char *)0x0) {
    for (local_58 = strchr(ptr3,0x29); local_58 != (char *)0x0 && ptr3 != (char *)0x0;
        local_58 = strchr(local_58,0x29)) {
      do {
        local_58 = local_58 + 1;
      } while (*local_58 == ' ');
      if ((*local_58 == '\0') || (*local_58 == '[')) break;
      ptr3 = strchr(ptr3 + 1,0x28);
    }
  }
  if (ptr3 == pcVar5) {
    sVar6 = strlen(ptr2);
    if (0x400 < sVar6) {
      *status = 0x7d;
      return 0x7d;
    }
    strcat(local_488,ptr2);
  }
  else if (pcVar5 == (char *)0x0) {
    if (0x400 < (long)ptr3 - (long)ptr2) {
      *status = 0x7d;
      return 0x7d;
    }
    strncat(local_488,ptr2,(long)ptr3 - (long)ptr2);
    pcVar5 = strchr(ptr3 + 1,0x29);
    if (pcVar5 == (char *)0x0) {
      *status = 0x7d;
      return 0x7d;
    }
  }
  else if ((ptr3 == (char *)0x0) || (pcVar5 <= ptr3)) {
    if (0x400 < (long)pcVar5 - (long)ptr2) {
      *status = 0x7d;
      return 0x7d;
    }
    strncat(local_488,ptr2,(long)pcVar5 - (long)ptr2);
  }
  else {
    if (0x400 < (long)ptr3 - (long)ptr2) {
      *status = 0x7d;
      return 0x7d;
    }
    strncat(local_488,ptr2,(long)ptr3 - (long)ptr2);
    pcVar5 = strchr(ptr3 + 1,0x29);
    if (pcVar5 == (char *)0x0) {
      *status = 0x7d;
      return 0x7d;
    }
  }
  sVar6 = strlen(local_488);
  slen = (int)sVar6;
  while ((slen = slen + -1, 0 < slen && (local_488[slen] == ' '))) {
    local_488[slen] = '\0';
  }
  sVar6 = strlen(local_488);
  iVar3 = (int)sVar6;
  slen = iVar3;
  do {
    iVar1 = slen;
    slen = iVar1 + -1;
    iVar2 = slen;
    if (slen < 0) break;
  } while (local_488[slen] != '+');
  if ((0 < slen) && (iVar4 = iVar3 - slen, slen = iVar1, iVar4 < 5)) {
    while ((slen < iVar3 &&
           (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)local_488[slen]] & 0x800) != 0))) {
      slen = slen + 1;
    }
    if (slen == iVar3) {
      local_488[iVar2] = '\0';
    }
  }
  sVar6 = strlen(local_78);
  sVar8 = strlen(local_488);
  if (sVar6 + sVar8 < 0x401) {
    strcat(rootname,local_78);
    strcat(rootname,local_488);
    url_local._4_4_ = *status;
  }
  else {
    *status = 0x7d;
    url_local._4_4_ = 0x7d;
  }
  return url_local._4_4_;
}

Assistant:

int ffrtnm(char *url, 
           char *rootname,
           int *status)
/*
   parse the input URL, returning the root name (filetype://basename).
*/

{ 
    int ii, jj, slen, infilelen;
    char *ptr1, *ptr2, *ptr3, *ptr4;
    char urltype[MAX_PREFIX_LEN];
    char infile[FLEN_FILENAME];

    if (*status > 0)
        return(*status);

    ptr1 = url;
    *rootname = '\0';
    *urltype = '\0';
    *infile  = '\0';

    /*  get urltype (e.g., file://, ftp://, http://, etc.)  */
    if (*ptr1 == '-')        /* "-" means read file from stdin */
    {
        strcat(urltype, "-");
        ptr1++;
    }
    else if (!strncmp(ptr1, "stdin", 5) || !strncmp(ptr1, "STDIN", 5))
    {
        strcat(urltype, "-");
        ptr1 = ptr1 + 5;
    }
    else
    {
        ptr2 = strstr(ptr1, "://");
        ptr3 = strstr(ptr1, "(" );

        if (ptr3 && (ptr3 < ptr2) )
        {
           /* the urltype follows a '(' character, so it must apply */
           /* to the output file, and is not the urltype of the input file */
           ptr2 = 0;   /* so reset pointer to zero */
        }


        if (ptr2)                  /* copy the explicit urltype string */ 
        {

	   if (ptr2 - ptr1 + 3 > MAX_PREFIX_LEN - 1)
	   {
               return(*status = URL_PARSE_ERROR);
           }
            strncat(urltype, ptr1, ptr2 - ptr1 + 3);
            ptr1 = ptr2 + 3;
        }
        else if (!strncmp(ptr1, "ftp:", 4) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "ftp://");
            ptr1 += 4;
        }
        else if (!strncmp(ptr1, "gsiftp:", 7) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "gsiftp://");
            ptr1 += 7;
        }
        else if (!strncmp(ptr1, "http:", 5) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "http://");
            ptr1 += 5;
        }
        else if (!strncmp(ptr1, "mem:", 4) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "mem://");
            ptr1 += 4;
        }
        else if (!strncmp(ptr1, "shmem:", 6) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "shmem://");
            ptr1 += 6;
        }
        else if (!strncmp(ptr1, "file:", 5) )
        {                              /* the 2 //'s are optional */
            ptr1 += 5;
        }

        /* else assume file driver    */
    }
 
       /*  get the input file name  */
    ptr2 = strchr(ptr1, '(');   /* search for opening parenthesis ( */
    ptr3 = strchr(ptr1, '[');   /* search for opening bracket [ */
    if (ptr2)
    {
       ptr4 = strchr(ptr2, ')');
       while (ptr4 && ptr2)
       {
          do {
             ++ptr4;
          }  while (*ptr4 == ' ');
          if (*ptr4 == 0 || *ptr4 == '[')
             break;
          ptr2 = strchr(ptr2+1, '(');
          ptr4 = strchr(ptr4, ')');
       }
    }

    if (ptr2 == ptr3)  /* simple case: no [ or ( in the file name */
    {

	if (strlen(ptr1) > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR);
        }

        strcat(infile, ptr1);
    }
    else if (!ptr3)     /* no bracket, so () enclose output file name */
    {

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR);
        }

        strncat(infile, ptr1, ptr2 - ptr1);
        ptr2++;

        ptr1 = strchr(ptr2, ')' );   /* search for closing ) */
        if (!ptr1)
            return(*status = URL_PARSE_ERROR);  /* error, no closing ) */

    }
    else if (ptr2 && (ptr2 < ptr3)) /* () enclose output name before bracket */
    {

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(infile, ptr1, ptr2 - ptr1);
        ptr2++;

        ptr1 = strchr(ptr2, ')' );   /* search for closing ) */
        if (!ptr1)
            return(*status = URL_PARSE_ERROR);  /* error, no closing ) */
    }
    else    /*   bracket comes first, so there is no output name */
    {
	if (ptr3 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(infile, ptr1, ptr3 - ptr1);
    }

       /* strip off any trailing blanks in the names */
    slen = strlen(infile);
    for (ii = slen - 1; ii > 0; ii--)   
    {
        if (infile[ii] == ' ')
            infile[ii] = '\0';
        else
            break;
    }

    /* --------------------------------------------- */
    /* check if the 'filename+n' convention has been */
    /* used to specifiy which HDU number to open     */ 
    /* --------------------------------------------- */

    jj = strlen(infile);

    for (ii = jj - 1; ii >= 0; ii--)
    {
        if (infile[ii] == '+')    /* search backwards for '+' sign */
            break;
    }

    if (ii > 0 && (jj - ii) < 5)  /* limit extension numbers to 4 digits */
    {
        infilelen = ii;
        ii++;


        for (; ii < jj; ii++)
        {
            if (!isdigit((int) infile[ii] ) ) /* are all the chars digits? */
                break;
        }

        if (ii == jj)      
        {
             /* yes, the '+n' convention was used.  */

             infile[infilelen] = '\0'; /* delete the extension number */
        }
    }

    if (strlen(urltype) + strlen(infile) > FLEN_FILENAME - 1)
    {
            return(*status = URL_PARSE_ERROR); 
    }

    strcat(rootname, urltype);  /* construct the root name */
    strcat(rootname, infile);

    return(*status);
}